

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * ImParseFormatFindStart(char *fmt)

{
  char cVar1;
  char c;
  char *fmt_local;
  
  for (fmt_local = fmt;
      (cVar1 = *fmt_local, cVar1 != '\0' && ((cVar1 != '%' || (fmt_local[1] == '%'))));
      fmt_local = fmt_local + 1) {
    if (cVar1 == '%') {
      fmt_local = fmt_local + 1;
    }
  }
  return fmt_local;
}

Assistant:

const char* ImParseFormatFindStart(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}